

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

sexp_uint_t sexp_allocated_bytes(sexp_conflict ctx,sexp_conflict x)

{
  sexp psVar1;
  long lVar2;
  undefined1 auVar3 [16];
  sexp_conflict t;
  sexp_uint_t res;
  sexp_conflict x_local;
  sexp_conflict ctx_local;
  sexp_uint_t local_8;
  
  if ((((ulong)x & 3) == 0) &&
     (psVar1 = (((ctx->value).type.setters)->value).type.id, auVar3._8_8_ = (long)psVar1 >> 0x3f,
     auVar3._0_8_ = (ulong)psVar1 & 0xfffffffffffffffe,
     (long)(ulong)x->tag < SUB168(auVar3 / SEXT816(2),0))) {
    lVar2 = *(long *)((long)&((((ctx->value).type.setters)->value).type.getters)->value +
                     (ulong)x->tag * 8 + 8);
    local_8 = *(long *)((long)&x->tag + (long)(int)*(short *)(lVar2 + 0x60)) *
              (ulong)*(ushort *)(lVar2 + 0x62) + (long)*(short *)(lVar2 + 0x5e);
  }
  else {
    local_8 = 0x20;
  }
  return local_8;
}

Assistant:

SEXP_API sexp_uint_t sexp_allocated_bytes (sexp ctx, sexp x) {
  sexp_uint_t res;
  sexp t;
  if (!sexp_pointerp(x) || (sexp_pointer_tag(x) >= sexp_context_num_types(ctx)))
    return sexp_heap_align(1);
  t = sexp_object_type(ctx, x);
  res = sexp_type_size_of_object(t, x) + SEXP_GC_PAD;
#if SEXP_USE_DEBUG_GC
  if (res == 0) {
    fprintf(stderr, SEXP_BANNER("%p zero-size object: %p (type tag: %d)"), ctx, x, sexp_pointer_tag(x));
    return 1;
  }
#endif
  return res;
}